

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

void __thiscall httplib::detail::stream_line_reader::append(stream_line_reader *this,char c)

{
  ulong uVar1;
  
  uVar1 = this->fixed_buffer_used_size_;
  if (uVar1 < this->fixed_buffer_size_ - 1) {
    this->fixed_buffer_used_size_ = uVar1 + 1;
    this->fixed_buffer_[uVar1] = c;
    this->fixed_buffer_[this->fixed_buffer_used_size_] = '\0';
    return;
  }
  if ((this->glowable_buffer_)._M_string_length == 0) {
    if (this->fixed_buffer_[uVar1] != '\0') {
      __assert_fail("fixed_buffer_[fixed_buffer_used_size_] == \'\\0\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/junaidrahim[P]locate-route/src/../include/httplib.h"
                    ,0x6d3,"void httplib::detail::stream_line_reader::append(char)");
    }
    std::__cxx11::string::_M_replace
              ((ulong)&this->glowable_buffer_,0,(char *)0x0,(ulong)this->fixed_buffer_);
  }
  std::__cxx11::string::push_back((char)&this->glowable_buffer_);
  return;
}

Assistant:

void append(char c) {
				if (fixed_buffer_used_size_ < fixed_buffer_size_ - 1) {
					fixed_buffer_[fixed_buffer_used_size_++] = c;
					fixed_buffer_[fixed_buffer_used_size_] = '\0';
				} else {
					if (glowable_buffer_.empty()) {
						assert(fixed_buffer_[fixed_buffer_used_size_] == '\0');
						glowable_buffer_.assign(fixed_buffer_, fixed_buffer_used_size_);
					}
					glowable_buffer_ += c;
				}
			}